

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

bool __thiscall
axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::reserve
          (Array<char,_axl::sl::ArrayDetails<char>_> *this,size_t count)

{
  size_t sVar1;
  BufHdr *pBVar2;
  BufHdr *pBVar3;
  BufHdr *this_00;
  BufHdr *pBVar4;
  ulong in_RSI;
  undefined8 *in_RDI;
  char *p;
  Ptr<axl::rc::BufHdr> hdr;
  size_t bufferSize;
  size_t size;
  BufHdr *in_stack_ffffffffffffff78;
  BufHdr *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  Ptr local_38 [16];
  size_t local_28;
  ulong local_20;
  byte local_1;
  
  if (in_RDI[1] != 0) {
    local_20 = in_RSI;
    sVar1 = rc::RefCount::getRefCount((RefCount *)in_RDI[1]);
    if ((sVar1 == 1) && (local_20 <= *(ulong *)(in_RDI[1] + 0x18))) {
      local_1 = 1;
      goto LAB_001259e8;
    }
  }
  local_28 = getAllocSize(0x12587f);
  pBVar2 = (BufHdr *)mem::allocate(0x125892);
  rc::BufHdr::BufHdr(pBVar2,in_stack_ffffffffffffff88,(uintptr_t)in_stack_ffffffffffffff80);
  rc::primeRefCount<axl::rc::BufHdr>
            (in_stack_ffffffffffffff80,(FreeFunc *)in_stack_ffffffffffffff78);
  rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>
            ((Ptr<axl::rc::BufHdr> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pBVar3 = rc::Ptr::operator_cast_to_BufHdr_(local_38);
  if (pBVar3 == (BufHdr *)0x0) {
    local_1 = 0;
  }
  else {
    pBVar3 = rc::Ptr::operator_cast_to_BufHdr_(local_38);
    SimpleArrayDetails<char>::setHdrCount(pBVar3,in_RDI[2]);
    this_00 = rc::Ptr::operator_cast_to_BufHdr_(local_38);
    pBVar4 = this_00 + 1;
    if (in_RDI[2] != 0) {
      SimpleArrayDetails<char>::constructCopy
                ((char *)this_00,(char *)in_stack_ffffffffffffff78,0x12597e);
    }
    if (in_RDI[1] != 0) {
      rc::RefCount::release(&this_00->super_RefCount);
    }
    *in_RDI = pBVar4;
    pBVar2 = rc::Ptr<axl::rc::BufHdr>::detach((Ptr<axl::rc::BufHdr> *)pBVar2,(RefCount **)pBVar3);
    in_RDI[1] = pBVar2;
    local_1 = 1;
  }
  rc::Ptr<axl::rc::BufHdr>::~Ptr((Ptr<axl::rc::BufHdr> *)0x1259e8);
LAB_001259e8:
  return (bool)(local_1 & 1);
}

Assistant:

bool
	reserve(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1 &&
			this->m_hdr->m_bufferSize >= size)
			return true;

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, this->m_count);

		T* p = (T*)(hdr + 1);

		if (this->m_count)
			Details::constructCopy(p, this->m_p, this->m_count);

		if (this->m_hdr)
			this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		return true;
	}